

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feat.c
# Opt level: O3

int32 feat_s2mfc_read_norm_pad
                (feat_t *fcb,char *file,int32 win,int32 sf,int32 ef,mfcc_t ***out_mfc,int32 maxfr,
                int32 cepsize)

{
  mfcc_t **ppmVar1;
  mfcc_t mVar2;
  mfcc_t *pointer;
  mfcc_t **ppmVar3;
  int32 iVar4;
  uint uVar5;
  FILE *__stream;
  char *fmt;
  long lVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  uint nfr;
  ulong uVar15;
  size_t __n;
  int32 n_float32;
  stat statbuf;
  uint local_10c;
  mfcc_t **local_108;
  FILE *local_100;
  size_t local_f8;
  ulong local_f0;
  size_t local_e8;
  ulong local_e0;
  ulong local_d8;
  ulong local_d0;
  __off_t local_c8;
  stat local_c0;
  
  if (out_mfc != (mfcc_t ***)0x0) {
    *out_mfc = (mfcc_t **)0x0;
  }
  uVar5 = ef;
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
          ,0x3ff,"Reading mfc file: \'%s\'[%d..%d]\n",file,(ulong)(uint)sf,ef);
  if (ef <= sf && -1 < ef) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
            ,0x401,"%s: End frame (%d) <= Start frame (%d)\n",file,(ulong)(uint)ef,sf);
    return -1;
  }
  iVar4 = stat_retry(file,&local_c0);
  if ((iVar4 < 0) || (__stream = fopen(file,"rb"), __stream == (FILE *)0x0)) {
    err_msg_system(ERR_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                   ,0x408,"Failed to open file \'%s\' for reading",file);
    return -1;
  }
  local_108 = (mfcc_t **)CONCAT44(local_108._4_4_,win);
  iVar4 = fread_retry(&local_10c,4,1,(FILE *)__stream);
  if (iVar4 != 1) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
            ,0x40e,"%s: fread(#floats) failed\n",file);
    goto LAB_001157e6;
  }
  uVar8 = (ulong)local_10c;
  iVar9 = local_10c * 4 + 4;
  uVar12 = local_10c;
  local_100 = __stream;
  if ((iVar9 == (int)local_c0.st_size) ||
     (uVar12 = local_10c >> 0x18 | (local_10c & 0xff0000) >> 8 | (local_10c & 0xff00) << 8 |
               local_10c << 0x18, uVar12 * 4 + 4 == (int)local_c0.st_size)) {
    local_10c = uVar12;
    if ((int)local_10c < 1) {
      fmt = "%s: Header size field (#floats) = %d\n";
      lVar6 = 0x426;
      uVar8 = (ulong)local_10c;
    }
    else {
      uVar12 = (int)local_10c / cepsize;
      if (uVar12 * cepsize != local_10c) {
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                ,0x42f,"Header size field: %d; not multiple of %d\n",(ulong)local_10c,
                (ulong)(uint)cepsize,uVar5);
        __stream = local_100;
        goto LAB_001157e6;
      }
      if ((0 < sf) && ((int)uVar12 <= sf)) {
        fmt = "%s: Start frame (%d) beyond file size (%d)\n";
        lVar6 = 0x438;
        uVar8 = (ulong)(uint)sf;
        uVar5 = uVar12;
        goto LAB_001157b6;
      }
      local_c8 = local_c0.st_size;
      if (ef < 0) {
LAB_00115863:
        ef = uVar12 - 1;
        iVar14 = (int)local_108;
      }
      else {
        iVar14 = (int)local_108;
        if ((int)uVar12 <= ef) {
          local_f8 = CONCAT44(local_f8._4_4_,iVar9);
          err_msg(ERR_WARN,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                  ,0x441,"%s: End frame (%d) beyond file size (%d), will truncate\n",file,
                  (ulong)(uint)ef,uVar12);
          iVar9 = (int)local_f8;
          goto LAB_00115863;
        }
      }
      iVar11 = uVar12 - 1;
      iVar7 = sf - iVar14;
      iVar14 = ef + iVar14;
      iVar13 = 0;
      if (0 < iVar7) {
        iVar13 = iVar7;
      }
      uVar10 = iVar7 >> 0x1f & -iVar7;
      uVar8 = (ulong)((iVar14 - uVar12) + 1);
      if (iVar14 < (int)uVar12) {
        uVar8 = 0;
        iVar11 = iVar14;
      }
      nfr = (iVar11 - iVar13) + 1;
      if ((int)uVar12 <= (int)nfr) {
        nfr = uVar12;
      }
      if ((maxfr < 1) || (uVar5 = nfr + uVar10 + (int)uVar8, (int)uVar5 <= maxfr)) {
        iVar14 = nfr + uVar10 + (int)uVar8;
        if (out_mfc == (mfcc_t ***)0x0) {
LAB_00115a8a:
          fclose(local_100);
          return iVar14;
        }
        local_f0 = CONCAT44(local_f0._4_4_,iVar13);
        local_f8 = CONCAT44(local_f8._4_4_,iVar9);
        local_e8 = (size_t)cepsize;
        local_e0 = (ulong)uVar10;
        local_d8 = (ulong)(nfr + uVar10);
        local_d0 = uVar8;
        local_108 = (mfcc_t **)
                    __ckd_calloc_2d__((long)iVar14,local_e8,4,
                                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                                      ,0x462);
        if (0 < iVar7) {
          fseek(local_100,(long)((int)local_f0 * cepsize) << 2,1);
        }
        local_10c = nfr * cepsize;
        local_f0 = local_e0 & 0xffffffff;
        pointer = local_108[local_f0];
        uVar5 = fread_retry(pointer,4,local_10c,(FILE *)local_100);
        if (uVar5 == local_10c) {
          ppmVar1 = local_108 + local_f0;
          if (((int)local_f8 != (int)local_c8) && (0 < (int)uVar5)) {
            lVar6 = 0;
            do {
              mVar2 = pointer[lVar6];
              pointer[lVar6] =
                   (mfcc_t)((uint)mVar2 >> 0x18 | ((uint)mVar2 & 0xff0000) >> 8 |
                            ((uint)mVar2 & 0xff00) << 8 | (int)mVar2 << 0x18);
              lVar6 = lVar6 + 1;
            } while (lVar6 < (int)local_10c);
          }
          feat_cmn(fcb,ppmVar1,nfr,1,1);
          feat_agc(fcb,ppmVar1,nfr,1,1);
          uVar8 = local_f0;
          ppmVar3 = local_108;
          if (0 < (int)local_e0) {
            local_f8 = local_e8 * 4;
            uVar15 = 0;
            do {
              memcpy(ppmVar3[uVar15],*ppmVar1,local_f8);
              uVar15 = uVar15 + 1;
            } while (uVar15 < uVar8);
          }
          ppmVar1 = local_108;
          if (0 < (int)local_d0) {
            lVar6 = (long)(int)local_d8;
            __n = local_e8 << 2;
            local_f8 = local_d0 & 0xffffffff;
            uVar8 = 0;
            do {
              memcpy(ppmVar1[lVar6 + uVar8],local_108[lVar6 + -1],__n);
              uVar8 = uVar8 + 1;
            } while (local_f8 != uVar8);
          }
          *out_mfc = local_108;
          goto LAB_00115a8a;
        }
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                ,0x46c,"%s: fread(%dx%d) (MFC data) failed\n",file,(ulong)nfr,cepsize);
        ckd_free_2d(local_108);
        __stream = local_100;
        goto LAB_001157e6;
      }
      fmt = "%s: Maximum output size(%d frames) < actual #frames(%d)\n";
      lVar6 = 0x45a;
      uVar8 = (ulong)(uint)maxfr;
    }
  }
  else {
    fmt = "%s: Header size field: %d(%08x); filesize: %d(%08x)\n";
    lVar6 = 0x41d;
    uVar5 = local_10c;
  }
LAB_001157b6:
  err_msg(ERR_ERROR,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
          ,lVar6,fmt,file,uVar8,uVar5);
  __stream = local_100;
LAB_001157e6:
  fclose(__stream);
  return -1;
}

Assistant:

static int32
feat_s2mfc_read_norm_pad(feat_t *fcb, char *file, int32 win,
            		 int32 sf, int32 ef,
            		 mfcc_t ***out_mfc,
            		 int32 maxfr,
            		 int32 cepsize)
{
    FILE *fp;
    int32 n_float32;
    float32 *float_feat;
    struct stat statbuf;
    int32 i, n, byterev;
    int32 start_pad, end_pad;
    mfcc_t **mfc;

    /* Initialize the output pointer to NULL, so that any attempts to
       free() it if we fail before allocating it will not segfault! */
    if (out_mfc)
        *out_mfc = NULL;
    E_INFO("Reading mfc file: '%s'[%d..%d]\n", file, sf, ef);
    if (ef >= 0 && ef <= sf) {
        E_ERROR("%s: End frame (%d) <= Start frame (%d)\n", file, ef, sf);
        return -1;
    }

    /* Find filesize; HACK!! To get around intermittent NFS failures, use stat_retry */
    if ((stat_retry(file, &statbuf) < 0)
        || ((fp = fopen(file, "rb")) == NULL)) {
        E_ERROR_SYSTEM("Failed to open file '%s' for reading", file);
        return -1;
    }

    /* Read #floats in header */
    if (fread_retry(&n_float32, sizeof(int32), 1, fp) != 1) {
        E_ERROR("%s: fread(#floats) failed\n", file);
        fclose(fp);
        return -1;
    }

    /* Check if n_float32 matches file size */
    byterev = 0;
    if ((int32) (n_float32 * sizeof(float32) + 4) != (int32) statbuf.st_size) { /* RAH, typecast both sides to remove compile warning */
        n = n_float32;
        SWAP_INT32(&n);

        if ((int32) (n * sizeof(float32) + 4) != (int32) (statbuf.st_size)) {   /* RAH, typecast both sides to remove compile warning */
            E_ERROR
                ("%s: Header size field: %d(%08x); filesize: %d(%08x)\n",
                 file, n_float32, n_float32, statbuf.st_size,
                 statbuf.st_size);
            fclose(fp);
            return -1;
        }

        n_float32 = n;
        byterev = 1;
    }
    if (n_float32 <= 0) {
        E_ERROR("%s: Header size field (#floats) = %d\n", file, n_float32);
        fclose(fp);
        return -1;
    }

    /* Convert n to #frames of input */
    n = n_float32 / cepsize;
    if (n * cepsize != n_float32) {
        E_ERROR("Header size field: %d; not multiple of %d\n", n_float32,
                cepsize);
        fclose(fp);
        return -1;
    }

    /* Check start and end frames */
    if (sf > 0) {
        if (sf >= n) {
            E_ERROR("%s: Start frame (%d) beyond file size (%d)\n", file,
                    sf, n);
            fclose(fp);
            return -1;
        }
    }
    if (ef < 0)
        ef = n-1;
    else if (ef >= n) {
        E_WARN("%s: End frame (%d) beyond file size (%d), will truncate\n",
               file, ef, n);
        ef = n-1;
    }

    /* Add window to start and end frames */
    sf -= win;
    ef += win;
    if (sf < 0) {
        start_pad = -sf;
        sf = 0;
    }
    else
        start_pad = 0;
    if (ef >= n) {
        end_pad = ef - n + 1;
        ef = n - 1;
    }
    else
        end_pad = 0;

    /* Limit n if indicated by [sf..ef] */
    if ((ef - sf + 1) < n)
        n = (ef - sf + 1);
    if (maxfr > 0 && n + start_pad + end_pad > maxfr) {
        E_ERROR("%s: Maximum output size(%d frames) < actual #frames(%d)\n",
                file, maxfr, n + start_pad + end_pad);
        fclose(fp);
        return -1;
    }

    /* If no output buffer was supplied, then skip the actual data reading. */
    if (out_mfc != NULL) {
        /* Position at desired start frame and read actual MFC data */
        mfc = (mfcc_t **)ckd_calloc_2d(n + start_pad + end_pad, cepsize, sizeof(mfcc_t));
        if (sf > 0)
            fseek(fp, sf * cepsize * sizeof(float32), SEEK_CUR);
        n_float32 = n * cepsize;
#ifdef FIXED_POINT
        float_feat = ckd_calloc(n_float32, sizeof(float32));
#else
        float_feat = mfc[start_pad];
#endif
        if (fread_retry(float_feat, sizeof(float32), n_float32, fp) != n_float32) {
            E_ERROR("%s: fread(%dx%d) (MFC data) failed\n", file, n, cepsize);
            ckd_free_2d(mfc);
            fclose(fp);
            return -1;
        }
        if (byterev) {
            for (i = 0; i < n_float32; i++) {
                SWAP_FLOAT32(&float_feat[i]);
            }
        }
#ifdef FIXED_POINT
        for (i = 0; i < n_float32; ++i) {
            mfc[start_pad][i] = FLOAT2MFCC(float_feat[i]);
        }
        ckd_free(float_feat);
#endif

        /* Normalize */
        feat_cmn(fcb, mfc + start_pad, n, 1, 1);
        feat_agc(fcb, mfc + start_pad, n, 1, 1);

        /* Replicate start and end frames if necessary. */
        for (i = 0; i < start_pad; ++i)
            memcpy(mfc[i], mfc[start_pad], cepsize * sizeof(mfcc_t));
        for (i = 0; i < end_pad; ++i)
            memcpy(mfc[start_pad + n + i], mfc[start_pad + n - 1],
                   cepsize * sizeof(mfcc_t));

        *out_mfc = mfc;
    }

    fclose(fp);
    return n + start_pad + end_pad;
}